

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O0

int BN_print_fp(FILE *fp,BIGNUM *a)

{
  BIO *a_00;
  int ret;
  BIO *b;
  BIGNUM *a_local;
  FILE *fp_local;
  
  a_00 = BIO_new_fp(fp,0);
  if (a_00 == (BIO *)0x0) {
    fp_local._4_4_ = 0;
  }
  else {
    fp_local._4_4_ = BN_print(a_00,a);
    BIO_free(a_00);
  }
  return fp_local._4_4_;
}

Assistant:

int BN_print_fp(FILE *fp, const BIGNUM *a) {
  BIO *b = BIO_new_fp(fp, BIO_NOCLOSE);
  if (b == NULL) {
    return 0;
  }

  int ret = BN_print(b, a);
  BIO_free(b);
  return ret;
}